

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::execExgDxDy<(moira::Instr)63,(moira::Mode)12,(moira::Size)4>(Moira *this,u16 opcode)

{
  undefined4 uVar1;
  u32 uVar2;
  ulong uVar3;
  
  uVar3 = (ulong)(opcode >> 9 & 7);
  uVar1 = *(undefined4 *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x58);
  *(undefined4 *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x58) =
       *(undefined4 *)((long)this->exec + uVar3 * 4 + -0x58);
  *(undefined4 *)((long)this->exec + uVar3 * 4 + -0x58) = uVar1;
  uVar2 = (this->reg).pc;
  (this->reg).pc0 = uVar2;
  (this->queue).ird = (this->queue).irc;
  uVar2 = readM<(moira::MemSpace)2,(moira::Size)2,4ul>(this,uVar2 + 2);
  (this->queue).irc = (u16)uVar2;
  (*this->_vptr_Moira[0x19])(this,2);
  return;
}

Assistant:

void
Moira::execExgDxDy(u16 opcode)
{
    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    std::swap(reg.d[src], reg.d[dst]);
    prefetch<POLLIPL>();

    sync(2);
}